

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O0

void __thiscall
register_has_no_reset::AlwaysFFVisitor::handle
          (AlwaysFFVisitor *this,ConditionalStatement *statement)

{
  bool bVar1;
  byte bVar2;
  Expression *pEVar3;
  UnaryExpression *pUVar4;
  _Storage<slang::SourceLocation,_true> visitor_00;
  undefined1 uVar5;
  long in_RSI;
  Expression *in_RDI;
  optional<slang::SourceLocation> oVar6;
  optional<slang::SourceLocation> foundLocation;
  LookupLhsIdentifier visitor;
  bool swapStatements;
  Statement *noResetStatement;
  Statement *resetStatement;
  UnaryOperator op;
  Condition *condition;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range2;
  LookupIdentifier lookupIdentifierVisitor;
  bool isResetNeg;
  bool isReset;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  LookupLhsIdentifier *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  LookupLhsIdentifier local_a8;
  byte local_79;
  Statement *local_78;
  Statement *local_70;
  UnaryOperator local_64;
  reference local_60;
  Condition *local_58;
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  local_50;
  long local_48;
  LookupIdentifier local_40;
  byte local_12;
  byte local_11;
  long local_10;
  
  if (*(long *)(in_RSI + 0x38) != 0) {
    local_11 = 0;
    local_12 = 0;
    local_10 = in_RSI;
    LookupIdentifier::LookupIdentifier
              ((LookupIdentifier *)in_RDI,
               (string_view *)
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),false);
    local_48 = local_10 + 0x20;
    local_50._M_current =
         (Condition *)
         std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                     *)CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
    local_58 = (Condition *)
               std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
               ::end((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
                      *)in_stack_ffffffffffffff48);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                               *)in_RDI,
                              (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_ffffffffffffff3f,
                                          CONCAT16(in_stack_ffffffffffffff3e,
                                                   in_stack_ffffffffffffff38))),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                 ::operator*(&local_50);
      slang::not_null<const_slang::ast::Expression_*>::operator->
                ((not_null<const_slang::ast::Expression_*> *)0x20aa0b);
      slang::ast::Expression::visit<LookupIdentifier&>
                (in_RDI,(LookupIdentifier *)
                        CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
      local_11 = LookupIdentifier::found(&local_40);
      if ((bool)local_11) {
        pEVar3 = slang::not_null<const_slang::ast::Expression_*>::operator->
                           ((not_null<const_slang::ast::Expression_*> *)0x20aa45);
        if (pEVar3->kind == UnaryOp) {
          pEVar3 = slang::not_null<const_slang::ast::Expression_*>::operator->
                             ((not_null<const_slang::ast::Expression_*> *)0x20aa54);
          pUVar4 = slang::ast::Expression::as<slang::ast::UnaryExpression>(pEVar3);
          local_64 = pUVar4->op;
          in_stack_ffffffffffffff3f = local_64 == BitwiseNot || local_64 == LogicalNot;
          local_12 = in_stack_ffffffffffffff3f;
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
      ::operator++(&local_50);
    }
    if ((local_11 & 1) != 0) {
      local_70 = *(Statement **)(local_10 + 0x30);
      local_78 = *(Statement **)(local_10 + 0x38);
      if ((local_12 & 1) == 0) {
        bVar2 = *(byte *)&(in_RDI->sourceRange).startLoc;
      }
      else {
        bVar2 = *(bool *)&(in_RDI->sourceRange).startLoc ^ 0xff;
      }
      local_79 = bVar2 & 1;
      if (local_79 != 0) {
        std::swap<slang::ast::Statement_const*>(&local_70,&local_78);
      }
      LookupLhsIdentifier::LookupLhsIdentifier
                ((LookupLhsIdentifier *)in_RDI,
                 (string_view *)
                 CONCAT17(in_stack_ffffffffffffff3f,CONCAT16(bVar2,in_stack_ffffffffffffff38)));
      slang::ast::Statement::visit<LookupLhsIdentifier&>
                ((Statement *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      bVar1 = LookupLhsIdentifier::found(&local_a8);
      if (bVar1) {
        oVar6 = LookupLhsIdentifier::foundLocation(&local_a8);
        visitor_00 = oVar6.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::SourceLocation>._M_payload;
        uVar5 = oVar6.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                super__Optional_payload_base<slang::SourceLocation>._M_engaged;
        LookupLhsIdentifier::reset((LookupLhsIdentifier *)CONCAT71(in_stack_ffffffffffffff51,uVar5))
        ;
        slang::ast::Statement::visit<LookupLhsIdentifier&>
                  ((Statement *)CONCAT71(in_stack_ffffffffffffff51,uVar5),
                   (LookupLhsIdentifier *)visitor_00);
        bVar1 = LookupLhsIdentifier::found(&local_a8);
        if (!bVar1) {
          (in_RDI->sourceRange).startLoc.field_0x1 = 1;
          (in_RDI->sourceRange).endLoc = (SourceLocation)visitor_00;
          *(char **)(in_RDI + 1) = (char *)CONCAT71(in_stack_ffffffffffffff51,uVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& statement) {
        // Early return, if there's no else clause on the conditional statement
        if (!statement.ifFalse) {
            return;
        }

        // Check if there is a reset in the conditional statement and if the signal is negated
        bool isReset = false;
        bool isResetNeg = false;

        LookupIdentifier lookupIdentifierVisitor(resetName, false);
        for (const auto& condition : statement.conditions) {
            condition.expr->visit(lookupIdentifierVisitor);
            isReset = lookupIdentifierVisitor.found();

            if (isReset) {
                if (condition.expr->kind == ExpressionKind::UnaryOp) {
                    auto op = condition.expr->as<UnaryExpression>().op;
                    isResetNeg = (op == UnaryOperator::BitwiseNot) ||
                                 (op == UnaryOperator::LogicalNot);
                }
                break;
            }
        }

        if (!isReset)
            return;

        auto resetStatement = &statement.ifTrue;
        auto noResetStatement = statement.ifFalse;

        bool swapStatements = isResetNeg ? !resetIsActiveHigh : resetIsActiveHigh;

        if (swapStatements) {
            std::swap(resetStatement, noResetStatement);
        }

        LookupLhsIdentifier visitor(name);
        noResetStatement->visit(visitor);
        if (visitor.found()) {
            auto foundLocation = visitor.foundLocation();
            visitor.reset();
            resetStatement->visit(visitor);
            if (!visitor.found()) {
                correctlyAssignedOnIfReset = true;
                errorLocation = foundLocation;
            }
        }
    }